

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::
cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&)>
::call(cni_helper<cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&),_cs::numeric_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  vector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    cni_helper<cs::numeric(*)(std::__cxx11::string_const&,std::__cxx11::string_const&,cs::numeric_const&),cs::numeric(*)(std::__cxx11::string_const&,std::__cxx11::string_const&,cs::numeric_const&)>
    ::_call<0,1,2>((numeric *)&local_88,args,in_RDX,
                   (sequence<0,_1,_2> *)&cov::make_sequence<0,0,1,2>::result);
    any::make_constant<cs::numeric,cs::numeric_const&>((any *)this,(numeric *)&local_88);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_a8,3);
  std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_a8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_c8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar2) {
    local_c8.field_2._M_allocated_capacity = *psVar2;
    local_c8.field_2._8_8_ = plVar1[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar2;
  }
  local_c8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string
            (&local_60,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_88,&local_c8,&local_60);
  cs::runtime_error::runtime_error(this_00,&local_88);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}